

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

int identify_regions(FIRSTPASS_STATS *stats_start,int total_frames,int offset,REGIONS *regions,
                    int *total_regions)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int *piVar8;
  double dVar9;
  int iVar10;
  undefined4 uVar11;
  REGIONS *regions_00;
  double *filt_intra_err;
  double *pdVar12;
  uint uVar13;
  long lVar14;
  REGION_TYPES *pRVar15;
  uint uVar16;
  REGIONS *pRVar17;
  int k;
  uint uVar18;
  int iVar19;
  int64_t *piVar20;
  undefined4 in_register_00000034;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  uint uVar25;
  REGION_TYPES RVar26;
  long lVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  int64_t *piVar32;
  long lVar33;
  bool bVar34;
  bool bVar35;
  double total_wt;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  int num_regions;
  uint local_d0;
  uint local_cc;
  ulong local_c8;
  uint local_bc;
  int *local_b8;
  REGIONS *local_b0;
  ulong local_a8;
  undefined8 local_a0;
  int64_t *local_98;
  int local_90;
  int local_8c;
  double *local_88;
  double *local_80;
  double *local_78;
  ulong local_70;
  int local_64;
  double *local_60;
  double *local_58;
  int64_t *local_50;
  double *local_48;
  REGION_TYPES *local_40;
  double *local_38;
  
  iVar10 = 0;
  if (1 < total_frames) {
    uVar31 = (ulong)(uint)total_frames;
    local_b8 = total_regions;
    local_b0 = regions;
    local_64 = offset;
    regions_00 = (REGIONS *)aom_malloc(uVar31 * 0x38);
    filt_intra_err = (double *)aom_calloc(uVar31,8);
    pdVar12 = (double *)aom_calloc(uVar31,8);
    local_88 = (double *)aom_calloc(uVar31,8);
    auVar38._0_4_ = -(uint)((int)regions_00 == 0 && (int)((ulong)regions_00 >> 0x20) == 0);
    auVar38._4_4_ = -(uint)((int)filt_intra_err == 0 && (int)((ulong)filt_intra_err >> 0x20) == 0);
    auVar38._8_4_ = -(uint)((int)pdVar12 == 0 && (int)((ulong)pdVar12 >> 0x20) == 0);
    auVar38._12_4_ = -(uint)((int)local_88 == 0 && (int)((ulong)local_88 >> 0x20) == 0);
    iVar10 = movmskps((int)local_88,auVar38);
    if (iVar10 == 0) {
      memset(regions_00,0,uVar31 * 0x38);
      local_a8 = (ulong)(total_frames - 1);
      piVar32 = &stats_start[-1].is_flash;
      local_80 = &stats_start[-1].intra_error;
      local_40 = &regions_00[-1].type;
      local_38 = &regions_00[-1].avg_cor_coeff;
      local_60 = &stats_start->coded_error;
      local_58 = &stats_start->intra_error;
      local_48 = &stats_start[1].intra_error;
      local_50 = &stats_start->is_flash;
      uVar13 = 0;
      local_90 = 0;
      local_a0 = CONCAT44(in_register_00000034,total_frames);
      local_98 = piVar32;
      local_78 = pdVar12;
      do {
        if ((int)uVar13 < (int)local_a0 && (uint)local_a8 != uVar13) {
          uVar16 = uVar13 - 3;
          local_c8 = (ulong)(int)uVar13;
          local_70 = (ulong)uVar13;
          uVar21 = uVar13;
          do {
            uVar21 = uVar21 + 1;
            uVar31 = (long)(int)uVar16;
            if ((long)(int)uVar16 < (long)local_c8) {
              uVar31 = local_c8;
            }
            uVar25 = uVar16;
            if ((int)uVar16 < (int)uVar13) {
              uVar25 = uVar13;
            }
            uVar23 = local_70 + 1;
            if ((stats_start[local_70].is_flash == 0) &&
               ((local_70 == 0 || (piVar32[local_70 * 0x1d] == 0)))) {
              dVar36 = stats_start[local_70].intra_error;
              dVar39 = stats_start[local_70].coded_error;
              if (dVar36 <= 0.01) {
                dVar36 = 0.01;
              }
              if (uVar13 < local_70) {
                piVar20 = piVar32 + uVar31 * 0x1d;
                lVar33 = (long)(int)uVar25;
                dVar43 = 0.0;
                auVar41 = ZEXT816(0);
                do {
                  if ((piVar20[0x1d] == 0) && ((lVar33 < 1 || (*piVar20 == 0)))) {
                    dVar44 = (double)piVar20[7];
                    dVar46 = (double)piVar20[9];
                    if (dVar44 <= 0.01) {
                      dVar44 = 0.01;
                    }
                    dVar47 = dVar46 / dVar44;
                    if (dVar46 / dVar44 <= dVar43) {
                      dVar47 = dVar43;
                    }
                    dVar43 = dVar47;
                    if (dVar46 <= auVar41._0_8_) {
                      dVar46 = auVar41._0_8_;
                    }
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = dVar46;
                  }
                  dVar44 = auVar41._0_8_;
                  lVar33 = lVar33 + 1;
                  piVar20 = piVar20 + 0x1d;
                } while (lVar33 < (long)local_70);
                if (local_70 < local_a8) {
LAB_001f3676:
                  lVar33 = (long)(int)uVar21 + -1;
                  pdVar12 = local_60 + (long)(int)uVar21 * 0x1d;
                  uVar25 = (int)local_70 + 3;
                  if ((int)(uint)local_a8 <= (int)uVar25) {
                    uVar25 = (uint)local_a8;
                  }
                  dVar47 = 0.0;
                  dVar46 = 0.0;
                  do {
                    if ((local_70 == 0) || (dVar45 = dVar46, local_98[local_70 * 0x1d] == 0)) {
                      dVar48 = pdVar12[-2];
                      dVar45 = *pdVar12;
                      if (dVar48 <= 0.01) {
                        dVar48 = 0.01;
                      }
                      dVar9 = dVar45 / dVar48;
                      if (dVar45 / dVar48 <= dVar47) {
                        dVar9 = dVar47;
                      }
                      dVar47 = dVar9;
                      if (dVar45 <= dVar46) {
                        dVar45 = dVar46;
                      }
                    }
                    lVar33 = lVar33 + 1;
                    pdVar12 = pdVar12 + 0x1d;
                    dVar46 = dVar45;
                  } while (lVar33 < (int)uVar25);
                  piVar32 = local_98;
                  if ((dVar43 < 0.001) && (dVar47 < 0.001)) goto LAB_001f3702;
                  dVar46 = stats_start[local_70].sr_coded_error;
                  if (stats_start[local_70].sr_coded_error <= stats_start[uVar23].sr_coded_error) {
                    dVar46 = stats_start[uVar23].sr_coded_error;
                  }
                }
                else {
                  if (dVar43 < 0.001) goto LAB_001f3702;
                  dVar45 = 0.0;
                  dVar47 = 0.0;
                  dVar46 = stats_start[local_70].sr_coded_error;
                }
                dVar48 = dVar39;
                if (dVar39 <= 0.01) {
                  dVar48 = 0.01;
                }
                if (dVar46 / dVar48 <= 1.2) {
                  if (dVar43 <= dVar47) {
                    dVar43 = dVar47;
                  }
                  if (dVar43 + dVar43 <= dVar39 / dVar36) goto LAB_001f3776;
                  if (dVar44 <= dVar45) {
                    dVar44 = dVar45;
                  }
                  if (dVar44 + dVar44 <= dVar39) goto LAB_001f3776;
                }
              }
              else {
                dVar43 = 0.0;
                dVar44 = 0.0;
                if (local_70 < local_a8) goto LAB_001f3676;
LAB_001f3702:
                if (0.02 <= dVar39 / dVar36) goto LAB_001f3776;
              }
            }
            uVar16 = uVar16 + 1;
            local_70 = uVar23;
          } while ((int)uVar23 != (int)local_a0);
        }
        local_70 = 0xffffffff;
LAB_001f3776:
        uVar16 = (int)local_70 - 1;
        if ((int)local_70 < 0) {
          uVar16 = (uint)local_a8;
        }
        if ((int)uVar16 < (int)uVar13) {
          regions_00->start = uVar13;
          iVar19 = 0;
        }
        else {
          lVar14 = (long)(int)uVar13;
          iVar10 = uVar16 + 1;
          local_c8 = CONCAT44(local_c8._4_4_,iVar10);
          uVar21 = uVar13 - 3;
          lVar33 = lVar14;
          uVar25 = uVar21;
          do {
            dVar36 = 0.0;
            lVar22 = 0;
            uVar29 = uVar25;
            do {
              uVar18 = uVar13;
              if ((int)uVar13 < (int)uVar29) {
                uVar18 = uVar29;
              }
              if ((int)uVar16 <= (int)uVar18) {
                uVar18 = uVar16;
              }
              if (stats_start[(int)uVar18].is_flash == 0) {
                dVar39 = *(double *)((long)&smooth_filter_stats_smooth_filt + lVar22);
                filt_intra_err[lVar33] =
                     stats_start[(int)uVar18].intra_error * dVar39 + filt_intra_err[lVar33];
                dVar36 = dVar36 + dVar39;
              }
              lVar22 = lVar22 + 8;
              uVar29 = uVar29 + 1;
            } while (lVar22 != 0x38);
            if (dVar36 <= 0.01) {
              dVar36 = stats_start[lVar33].intra_error;
            }
            else {
              dVar36 = filt_intra_err[lVar33] / dVar36;
            }
            filt_intra_err[lVar33] = dVar36;
            lVar33 = lVar33 + 1;
            uVar25 = uVar25 + 1;
            lVar22 = lVar14;
          } while (iVar10 != (int)lVar33);
          do {
            dVar36 = 0.0;
            lVar33 = 0;
            uVar25 = uVar21;
            do {
              uVar29 = uVar13;
              if ((int)uVar13 < (int)uVar25) {
                uVar29 = uVar25;
              }
              if ((int)uVar16 <= (int)uVar29) {
                uVar29 = uVar16;
              }
              if ((stats_start[(int)uVar29].is_flash == 0) &&
                 (((int)uVar29 < 1 || (piVar32[(ulong)uVar29 * 0x1d] == 0)))) {
                dVar39 = *(double *)((long)&smooth_filter_stats_smooth_filt + lVar33);
                local_78[lVar22] = stats_start[(int)uVar29].coded_error * dVar39 + local_78[lVar22];
                dVar36 = dVar36 + dVar39;
              }
              lVar33 = lVar33 + 8;
              uVar25 = uVar25 + 1;
            } while (lVar33 != 0x38);
            if (dVar36 <= 0.01) {
              dVar36 = stats_start[lVar22].coded_error;
            }
            else {
              dVar36 = local_78[lVar22] / dVar36;
            }
            local_78[lVar22] = dVar36;
            lVar22 = lVar22 + 1;
            uVar21 = uVar21 + 1;
          } while (iVar10 != (int)lVar22);
          if (uVar13 == uVar16) {
            local_88[uVar13] = 0.0;
          }
          else {
            pdVar12 = local_88 + lVar14;
            uVar21 = uVar13 - 1;
            do {
              uVar25 = uVar13;
              if ((int)uVar13 < (int)uVar21) {
                uVar25 = uVar21;
              }
              uVar29 = uVar21 + 2;
              if ((int)uVar16 <= (int)(uVar21 + 2)) {
                uVar29 = uVar16;
              }
              *pdVar12 = (local_78[(int)uVar29] - local_78[(int)uVar25]) /
                         (double)(int)(uVar29 - uVar25);
              pdVar12 = pdVar12 + 1;
              uVar21 = uVar21 + 1;
            } while (uVar16 != uVar21);
          }
          regions_00->start = uVar13;
          iVar19 = 0;
          do {
            iVar28 = -3;
            iVar30 = 0;
            auVar40._8_8_ = 0x3f50624dd2f1a9fc;
            auVar40._0_8_ = 0x3f50624dd2f1a9fc;
            auVar37._8_8_ = 0x3f50624dd2f1a9fc;
            auVar37._0_8_ = 0x3f50624dd2f1a9fc;
            do {
              iVar5 = (int)lVar14;
              uVar21 = iVar5 + iVar28;
              if (iVar5 + iVar28 <= (int)uVar13) {
                uVar21 = uVar13;
              }
              if ((int)uVar16 <= (int)uVar21) {
                uVar21 = uVar16;
              }
              if ((stats_start[(int)uVar21].is_flash == 0) &&
                 (((int)uVar21 < 1 || (piVar32[(ulong)uVar21 * 0x1d] == 0)))) {
                dVar43 = auVar37._0_8_;
                dVar36 = stats_start[(int)uVar21].intra_error;
                dVar39 = stats_start[(int)uVar21].coded_error;
                dVar44 = auVar40._0_8_;
                iVar30 = iVar30 + 1;
                auVar40._8_8_ = auVar40._8_8_ + dVar39;
                auVar40._0_8_ = dVar39 * dVar39 + dVar44;
                auVar37._8_8_ = auVar37._8_8_ + dVar36;
                auVar37._0_8_ = dVar36 * dVar36 + dVar43;
              }
              iVar28 = iVar28 + 1;
            } while (iVar28 != 4);
            if (iVar30 < 1) {
              RVar26 = HIGH_VAR_REGION;
            }
            else {
              auVar42._0_8_ = (double)iVar30;
              auVar42._8_8_ = auVar42._0_8_;
              auVar38 = divpd(auVar37,auVar42);
              auVar41 = divpd(auVar40,auVar42);
              dVar36 = auVar38._8_8_;
              dVar39 = auVar41._8_8_;
              if ((1.04 <= auVar41._0_8_ / (dVar39 * dVar39)) ||
                 (bVar24 = true, 0.05 <= ABS(local_88[lVar14]) / dVar39)) {
                bVar24 = dVar39 / dVar36 < 0.05;
              }
              RVar26 = (byte)(dVar36 * 0.5 <= dVar39 | ~bVar24 |
                             1.03 <= auVar38._0_8_ / (dVar36 * dVar36)) & HIGH_VAR_REGION;
            }
            pRVar15 = &regions_00[iVar19].type;
            if (regions_00[iVar19].start == iVar5) {
LAB_001f3afa:
              *pRVar15 = RVar26;
            }
            else if (RVar26 != *pRVar15) {
              regions_00[iVar19].last = iVar5 + -1;
              iVar19 = iVar19 + 1;
              regions_00[iVar19].start = iVar5;
              pRVar15 = &regions_00[iVar19].type;
              goto LAB_001f3afa;
            }
            lVar14 = lVar14 + 1;
          } while (iVar10 != (int)lVar14);
        }
        regions_00[iVar19].last = uVar16;
        local_d0 = iVar19 + 1;
        remove_short_regions(regions_00,(int *)&local_d0,STABLE_REGION,3);
        remove_short_regions(regions_00,(int *)&local_d0,HIGH_VAR_REGION,3);
        uVar13 = local_d0;
        lVar33 = (long)(int)local_d0;
        if (0 < lVar33) {
          uVar16 = 0;
          do {
            analyze_region(stats_start,uVar16,regions_00);
            uVar16 = uVar16 + 1;
          } while (uVar13 != uVar16);
          lVar14 = 0;
          do {
            if (regions_00[lVar14].type != STABLE_REGION) {
              if (lVar14 != 0) {
                iVar10 = regions_00[lVar14 + -1].last;
                lVar22 = (long)iVar10;
                iVar19 = regions_00[lVar14 + -1].start;
                iVar30 = iVar19 + 1;
                if (iVar19 + 1 < iVar10 + -6) {
                  iVar30 = iVar10 + -6;
                }
                if (iVar19 < iVar10) {
                  lVar27 = (long)iVar19 + 1;
                  if ((long)iVar19 + 1 < lVar22 + -6) {
                    lVar27 = lVar22 + -6;
                  }
                  iVar19 = iVar30 + -1;
                  pdVar12 = local_58 + lVar27 * 0x1d;
                  dVar36 = 0.0;
                  do {
                    dVar36 = dVar36 + *pdVar12;
                    iVar19 = iVar19 + 1;
                    pdVar12 = pdVar12 + 0x1d;
                  } while (iVar10 != iVar19);
                  if (iVar10 + 1 != iVar30) {
                    dVar36 = dVar36 / (double)((iVar10 + 1) - iVar30);
                    if (dVar36 <= 0.001) {
                      dVar36 = 0.001;
                    }
                    if (iVar10 < regions_00[lVar14].last) {
                      iVar10 = iVar10 + 2;
                      lVar27 = regions_00[lVar14].last - lVar22;
                      pdVar12 = local_48 + lVar22 * 0x1d;
                      iVar19 = 0;
                      do {
                        if ((0.1 <= ABS(*pdVar12 - dVar36) / dVar36) ||
                           (iVar19 = iVar19 - (uint)(pdVar12[0x18] <= 0.995 ||
                                                    0.1 <= pdVar12[2] / dVar36), iVar19 < 0)) break;
                        (regions_00 + lVar14)[-1].last = iVar10 + -1;
                        regions_00[lVar14].start = iVar10;
                        iVar10 = iVar10 + 1;
                        pdVar12 = pdVar12 + 0x1d;
                        lVar27 = lVar27 + -1;
                      } while (lVar27 != 0);
                    }
                  }
                }
              }
              if (lVar14 < lVar33 + -1) {
                iVar10 = regions_00[lVar14 + 1].start;
                lVar22 = (long)iVar10;
                iVar19 = regions_00[lVar14 + 1].last + -1;
                if (iVar10 + 6 < regions_00[lVar14 + 1].last) {
                  iVar19 = iVar10 + 6;
                }
                if (iVar10 <= iVar19) {
                  iVar19 = iVar19 + 1;
                  pdVar12 = local_58 + lVar22 * 0x1d;
                  dVar36 = 0.0;
                  iVar30 = iVar19;
                  do {
                    dVar36 = dVar36 + *pdVar12;
                    iVar30 = iVar30 + -1;
                    pdVar12 = pdVar12 + 0x1d;
                  } while (iVar10 != iVar30);
                  if (iVar19 != iVar10) {
                    dVar36 = dVar36 / (double)(iVar19 - iVar10);
                    if (dVar36 <= 0.001) {
                      dVar36 = 0.001;
                    }
                    iVar19 = regions_00[lVar14].start;
                    if (iVar19 < iVar10) {
                      iVar10 = iVar10 + -2;
                      pdVar12 = local_60 + lVar22 * 0x1d;
                      iVar30 = 1;
                      do {
                        if ((0.1 <= ABS(pdVar12[-0x1f] - dVar36) / dVar36) ||
                           (iVar30 = iVar30 - (uint)(pdVar12[-7] <= 0.995 ||
                                                    0.1 <= *pdVar12 / dVar36), iVar30 < 0)) break;
                        lVar22 = lVar22 + -1;
                        (regions_00 + lVar14)[1].start = iVar10 + 1;
                        regions_00[lVar14].last = iVar10;
                        iVar10 = iVar10 + -1;
                        pdVar12 = pdVar12 + -0x1d;
                      } while (iVar19 < lVar22);
                    }
                  }
                }
              }
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != lVar33);
        }
        cleanup_regions(regions_00,(int *)&local_d0);
        remove_short_regions(regions_00,(int *)&local_d0,HIGH_VAR_REGION,3);
        uVar13 = local_d0;
        if (0 < (int)local_d0) {
          uVar16 = 0;
          do {
            analyze_region(stats_start,uVar16,regions_00);
            uVar16 = uVar16 + 1;
          } while (uVar13 != uVar16);
          local_cc = 0;
          if (uVar13 != 1) {
            uVar16 = 0;
            do {
              pRVar17 = regions_00 + (int)uVar16;
              if (regions_00[(int)uVar16].type == HIGH_VAR_REGION) {
                if ((0 < (int)uVar16) && (pRVar17->last - pRVar17->start < 0xd)) {
                  if ((((pRVar17->avg_coded_err < regions_00[(ulong)uVar16 - 1].avg_coded_err * 0.99
                        ) || (regions_00[(ulong)uVar16 - 1].avg_cor_coeff * 1.001 <
                              pRVar17->avg_cor_coeff)) && (uVar16 < uVar13 - 1)) &&
                     ((pRVar17->avg_coded_err < pRVar17[1].avg_coded_err * 0.99 ||
                      (pRVar17[1].avg_cor_coeff * 1.001 < pRVar17->avg_cor_coeff))))
                  goto LAB_001f3f43;
                }
LAB_001f3f6e:
                uVar16 = uVar16 + 1;
                local_cc = uVar16;
              }
              else {
                if ((regions_00[(int)uVar16].type != STABLE_REGION) ||
                   (((int)uVar16 < 1 || (0xc < pRVar17->last - pRVar17->start)))) goto LAB_001f3f6e;
                if (((pRVar17->avg_coded_err <= regions_00[(ulong)uVar16 - 1].avg_coded_err * 1.01)
                    && (dVar36 = regions_00[(ulong)uVar16 - 1].avg_cor_coeff * 0.999,
                       dVar36 < pRVar17->avg_cor_coeff || dVar36 == pRVar17->avg_cor_coeff)) ||
                   ((uVar13 - 1 <= uVar16 ||
                    ((pRVar17->avg_coded_err <= pRVar17[1].avg_coded_err * 1.01 &&
                     (dVar36 = pRVar17[1].avg_cor_coeff * 0.999,
                     dVar36 < pRVar17->avg_cor_coeff || dVar36 == pRVar17->avg_cor_coeff))))))
                goto LAB_001f3f6e;
LAB_001f3f43:
                remove_region(2,regions_00,(int *)&local_d0,(int *)&local_cc);
                uVar16 = local_cc;
                analyze_region(stats_start,local_cc - 1,regions_00);
              }
            } while (((int)uVar16 < (int)local_d0) && (uVar13 = local_d0, 1 < (int)local_d0));
          }
        }
        remove_short_regions(regions_00,(int *)&local_d0,STABLE_REGION,7);
        remove_short_regions(regions_00,(int *)&local_d0,HIGH_VAR_REGION,3);
        uVar13 = local_d0;
        if (0 < (int)local_d0) {
          uVar16 = 0;
          do {
            analyze_region(stats_start,uVar16,regions_00);
            uVar16 = uVar16 + 1;
          } while (uVar13 != uVar16);
          local_cc = 0;
          iVar10 = 0;
          do {
            local_c8 = CONCAT44(local_c8._4_4_,iVar10);
            lVar33 = (long)(int)local_cc;
            RVar26 = regions_00[lVar33].type;
            uVar16 = local_cc;
            while (RVar26 != STABLE_REGION) {
              pRVar17 = regions_00 + lVar33;
              iVar10 = pRVar17->start;
              if (iVar10 <= pRVar17->last) {
                piVar20 = local_50 + (long)iVar10 * 0x1d;
                iVar19 = 0;
                uVar23 = 0;
                uVar31 = (long)iVar10;
                local_cc = uVar16;
                do {
                  iVar10 = (int)uVar31;
                  if ((uVar16 == 0) && (iVar10 == pRVar17->start)) {
                    uVar16 = 0;
                  }
                  else if ((*piVar20 == 0) && (((long)uVar31 < 1 || (piVar20[-0x1d] == 0)))) {
                    dVar36 = (double)piVar20[-0x16];
                    dVar39 = dVar36 - (double)piVar20[-0x33];
                    if (dVar36 <= 0.01) {
                      dVar36 = 0.01;
                    }
                    iVar30 = ((0.0 < dVar39) - 1) + (uint)(0.0 < dVar39);
                    if (ABS(dVar39) / dVar36 <= 0.05) {
                      iVar30 = 0;
                    }
                    piVar32 = local_98;
                    if (iVar19 != iVar30) {
                      if (iVar19 != 0) {
                        insert_region((int)uVar23,iVar10 + -1,BLENDING_REGION,regions_00,
                                      (int *)&local_d0,(int *)&local_cc);
                        uVar16 = local_cc;
                      }
                      piVar32 = local_98;
                      iVar19 = iVar30;
                      if ((uVar16 == 0) && (iVar10 == regions_00->start + 1)) {
                        uVar23 = (ulong)(iVar10 - 1);
                        uVar16 = 0;
                      }
                      else {
                        uVar23 = uVar31 & 0xffffffff;
                      }
                    }
                  }
                  pRVar17 = regions_00 + (int)uVar16;
                  piVar20 = piVar20 + 0x1d;
                  bVar24 = (long)uVar31 < (long)regions_00[(int)uVar16].last;
                  uVar31 = uVar31 + 1;
                } while (bVar24);
                if (iVar19 != 0) {
                  insert_region((int)uVar23,regions_00[(int)uVar16].last,BLENDING_REGION,regions_00,
                                (int *)&local_d0,(int *)&local_cc);
                  uVar16 = local_cc;
                }
              }
              local_cc = uVar16 + 1;
              uVar13 = local_d0;
              if ((int)local_d0 <= (int)local_cc) {
                uVar11 = CONCAT31((int3)(local_cc >> 8),(int)local_c8 == 0);
                goto LAB_001f41b5;
              }
              lVar33 = (long)(int)local_cc;
              uVar16 = local_cc;
              RVar26 = regions_00[lVar33].type;
            }
            local_cc = uVar16 + 1;
            iVar10 = (int)local_c8 + 1;
          } while ((int)local_cc < (int)uVar13);
          uVar11 = 0;
LAB_001f41b5:
          if (0 < (int)uVar13) {
            local_c8 = CONCAT44(local_c8._4_4_,uVar11);
            uVar16 = 0;
            do {
              analyze_region(stats_start,uVar16,regions_00);
              uVar16 = uVar16 + 1;
            } while (uVar13 != uVar16);
            lVar33 = 0;
            do {
              if ((*(int *)((long)&regions_00->type + lVar33) == 3) &&
                 ((*(int *)((long)&regions_00->last + lVar33) ==
                   *(int *)((long)&regions_00->start + lVar33) ||
                  (pdVar12 = (double *)((long)&regions_00->avg_cor_coeff + lVar33),
                  *pdVar12 <= 0.6 && *pdVar12 != 0.6 || (local_c8 & 1) != 0)))) {
                *(undefined4 *)((long)&regions_00->type + lVar33) = 1;
              }
              lVar33 = lVar33 + 0x38;
            } while ((ulong)uVar13 * 0x38 - lVar33 != 0);
            uVar16 = 0;
            do {
              analyze_region(stats_start,uVar16,regions_00);
              uVar16 = uVar16 + 1;
            } while (uVar13 != uVar16);
            local_cc = 1;
            if (uVar13 != 1) {
              uVar16 = 1;
              do {
                if ((((((int)(uVar13 - 1) <= (int)uVar16) ||
                      (regions_00[(int)uVar16].type != HIGH_VAR_REGION)) ||
                     (pRVar17 = regions_00 + (int)uVar16, pRVar17[-1].type != BLENDING_REGION)) ||
                    ((pRVar17[1].type != BLENDING_REGION || (2 < pRVar17->last - pRVar17->start))))
                   || ((local_80[(long)pRVar17[-1].last * 0x1d] <=
                        stats_start[pRVar17[-1].last].intra_error &&
                        stats_start[pRVar17[-1].last].intra_error !=
                        local_80[(long)pRVar17[-1].last * 0x1d] ||
                       (stats_start[pRVar17[1].last].intra_error <
                        local_80[(long)pRVar17[1].last * 0x1d] ||
                        stats_start[pRVar17[1].last].intra_error ==
                        local_80[(long)pRVar17[1].last * 0x1d])))) {
LAB_001f4659:
                  if ((regions_00[(long)(int)uVar16 + -1].type == BLENDING_REGION) &&
                     (regions_00[(int)uVar16].type == BLENDING_REGION)) {
                    iVar10 = regions_00[(int)uVar16].last;
                    if (iVar10 - regions_00[(long)(int)uVar16 + -1].start < 3) {
                      regions_00[(long)(int)uVar16 + -1].type = HIGH_VAR_REGION;
                    }
                    else {
                      iVar19 = regions_00[(long)(int)uVar16 + -1].last;
                      if ((stats_start[iVar19].intra_error <
                           stats_start[(long)iVar19 + -1].intra_error ||
                           stats_start[iVar19].intra_error ==
                           stats_start[(long)iVar19 + -1].intra_error) &&
                         (local_80[(long)iVar10 * 0x1d] <= stats_start[iVar10].intra_error &&
                          stats_start[iVar10].intra_error != local_80[(long)iVar10 * 0x1d])) {
                        iVar10 = iVar19 - regions_00[(long)(int)uVar16 + -1].start;
                        if (iVar10 < 2) {
                          dVar36 = stats_start[iVar19].coded_error;
                          if (stats_start[iVar19].coded_error <=
                              stats_start[(long)iVar19 + -1].coded_error) {
                            dVar36 = stats_start[(long)iVar19 + -1].coded_error;
                          }
                          if (dVar36 <= 0.001) {
                            dVar36 = 0.001;
                          }
                          dVar36 = stats_start[iVar19].sr_coded_error / dVar36;
                          dVar39 = regions_00[(int)uVar16].avg_sr_fr_ratio;
                        }
                        else {
                          dVar36 = stats_start[iVar19].coded_error;
                          if (stats_start[iVar19].coded_error <=
                              stats_start[(long)iVar19 + -1].coded_error) {
                            dVar36 = stats_start[(long)iVar19 + -1].coded_error;
                          }
                          if (dVar36 <= 0.001) {
                            dVar36 = 0.001;
                          }
                          dVar36 = stats_start[iVar19].sr_coded_error / dVar36;
                          dVar39 = ((double)(iVar10 + 1) *
                                    regions_00[(long)(int)uVar16 + -1].avg_sr_fr_ratio - dVar36) /
                                   (double)iVar10;
                          if (regions_00[(int)uVar16].avg_sr_fr_ratio <= dVar39) {
                            dVar39 = regions_00[(int)uVar16].avg_sr_fr_ratio;
                          }
                        }
                        if (dVar39 * 0.95 < dVar36) {
                          iVar10 = 0;
                          goto LAB_001f47c8;
                        }
                      }
                      local_8c = uVar16 - 1;
                      insert_region(iVar19,iVar19,HIGH_VAR_REGION,regions_00,(int *)&local_d0,
                                    &local_8c);
                      iVar10 = local_8c;
                      analyze_region(stats_start,local_8c,regions_00);
                      uVar16 = iVar10 + 1;
                      analyze_region(stats_start,uVar16,regions_00);
                    }
                  }
                  uVar16 = uVar16 + 1;
                  local_cc = uVar16;
                }
                else {
                  dVar36 = pRVar17[-1].avg_sr_fr_ratio;
                  if (pRVar17[1].avg_sr_fr_ratio <= pRVar17[-1].avg_sr_fr_ratio) {
                    dVar36 = pRVar17[1].avg_sr_fr_ratio;
                  }
                  if (pRVar17->avg_sr_fr_ratio <= dVar36 * 0.95) goto LAB_001f4659;
                  pRVar17->type = BLENDING_REGION;
                  iVar10 = 2;
LAB_001f47c8:
                  remove_region(iVar10,regions_00,(int *)&local_d0,(int *)&local_cc);
                  uVar16 = local_cc;
                  analyze_region(stats_start,local_cc - 1,regions_00);
                }
                uVar13 = local_d0;
              } while ((int)uVar16 < (int)local_d0);
            }
          }
        }
        cleanup_regions(regions_00,(int *)&local_d0);
        pRVar15 = local_40;
        local_cc = 0;
        auVar38 = _DAT_004c9b50;
        uVar13 = local_d0;
        if (1 < (int)local_d0) {
          do {
            lVar33 = (long)(int)local_cc;
            pRVar17 = regions_00 + lVar33;
            if (regions_00[lVar33].type == HIGH_VAR_REGION) {
              bVar24 = 3 < pRVar17->last - pRVar17->start;
LAB_001f42bc:
              bVar4 = false;
            }
            else {
              bVar24 = true;
              if (regions_00[lVar33].type != BLENDING_REGION) goto LAB_001f42bc;
              bVar4 = pRVar17->last - pRVar17->start < 4;
            }
            if ((int)local_cc < 1) {
              bVar34 = pRVar17[1].type == STABLE_REGION;
LAB_001f4302:
              bVar35 = false;
              if ((int)local_cc < (int)(uVar13 - 1)) {
                bVar35 = pRVar17[1].type == BLENDING_REGION;
              }
            }
            else {
              if (pRVar15[lVar33 * 0xe] == STABLE_REGION) {
                bVar34 = true;
                goto LAB_001f4302;
              }
              bVar34 = false;
              if (local_cc < uVar13 - 1) {
                bVar34 = pRVar17[1].type == STABLE_REGION;
              }
              bVar35 = true;
              if (pRVar15[lVar33 * 0xe] != BLENDING_REGION) goto LAB_001f4302;
            }
            if ((bVar4) ||
               (!bVar24 &&
                (byte)(((int)local_cc < (int)(uVar13 - 1)) + (0 < (int)local_cc)) <=
                (byte)(bVar35 + bVar34))) {
              dVar36 = 1.0;
              if (0 < (int)local_cc) {
                dVar36 = (double)((ulong)(regions_00[lVar33].avg_cor_coeff - local_38[lVar33 * 7]) &
                                 auVar38._0_8_);
              }
              dVar39 = 1.0;
              if ((int)local_cc < (int)(uVar13 - 1)) {
                dVar39 = (double)((ulong)(regions_00[lVar33].avg_cor_coeff -
                                         pRVar17[1].avg_cor_coeff) & auVar38._0_8_);
              }
              remove_region((uint)(dVar39 < dVar36),regions_00,(int *)&local_d0,(int *)&local_cc);
              auVar38 = _DAT_004c9b50;
              uVar13 = local_d0;
            }
            else {
              local_cc = local_cc + 1;
            }
          } while ((1 < (int)uVar13) && ((int)local_cc < (int)uVar13));
        }
        cleanup_regions(regions_00,(int *)&local_d0);
        local_bc = 0;
        uVar13 = local_d0;
        if (0 < (int)local_d0) {
          do {
            if (regions_00[(int)local_bc].type == STABLE_REGION) {
              iVar10 = regions_00[(int)local_bc].start;
              iVar19 = regions_00[(int)local_bc].last;
              if (iVar10 <= iVar19) {
                piVar20 = local_50 + (long)iVar10 * 0x1d;
                do {
                  if (*piVar20 != 0) {
                    insert_region(iVar10,iVar10,HIGH_VAR_REGION,regions_00,(int *)&local_d0,
                                  (int *)&local_bc);
                  }
                  iVar10 = iVar10 + 1;
                  piVar20 = piVar20 + 0x1d;
                  piVar32 = local_98;
                  uVar13 = local_d0;
                } while (iVar19 + 1 != iVar10);
              }
            }
            local_bc = local_bc + 1;
          } while ((int)local_bc < (int)uVar13);
        }
        cleanup_regions(regions_00,(int *)&local_d0);
        if ((long)(int)local_d0 < 1) {
          uVar13 = local_d0;
          local_bc = 0;
        }
        else {
          uVar16 = local_d0 - 1;
          lVar33 = 0;
          do {
            if ((*(int *)((long)&regions_00->last + lVar33) <
                 *(int *)((long)&regions_00->start + lVar33)) &&
               (uVar13 = uVar16, local_bc = uVar16, (ulong)uVar16 * 0x38 - lVar33 == 0)) break;
            puVar1 = (undefined8 *)((long)&regions_00->start + lVar33);
            *(undefined8 *)((long)&local_b0[local_90].type + lVar33) = puVar1[6];
            uVar6 = *puVar1;
            uVar7 = puVar1[1];
            auVar38 = *(undefined1 (*) [16])(puVar1 + 2);
            *(undefined1 (*) [16])((long)&local_b0[local_90].avg_intra_err + lVar33) =
                 *(undefined1 (*) [16])(puVar1 + 4);
            *(undefined1 (*) [16])((long)&local_b0[local_90].avg_cor_coeff + lVar33) = auVar38;
            puVar1 = (undefined8 *)((long)&local_b0[local_90].start + lVar33);
            *puVar1 = uVar6;
            puVar1[1] = uVar7;
            lVar33 = lVar33 + 0x38;
            uVar13 = local_d0;
            local_bc = local_d0;
          } while ((long)(int)local_d0 * 0x38 - lVar33 != 0);
        }
        iVar19 = uVar13 + local_90;
        iVar10 = (int)local_70;
        if (iVar10 < 0) {
          *local_b8 = iVar19;
          if (0 < iVar19) {
            iVar10 = 0;
            do {
              analyze_region(stats_start,iVar10,local_b0);
              iVar10 = iVar10 + 1;
            } while (iVar19 != iVar10);
            iVar10 = *local_b8;
            if (0 < iVar10) {
              pRVar15 = &local_b0->type;
              lVar33 = 0;
              do {
                if ((*pRVar15 == SCENECUT_REGION) &&
                   (0.8 <= (1.0 - stats_start[((REGIONS *)(pRVar15 + -0xc))->start].noise_var /
                                  *(double *)(pRVar15 + -4)) * *(double *)(pRVar15 + -8))) {
                  *pRVar15 = HIGH_VAR_REGION;
                  iVar10 = *local_b8;
                }
                lVar33 = lVar33 + 1;
                pRVar15 = pRVar15 + 0xe;
              } while (lVar33 < iVar10);
            }
          }
          piVar8 = local_b8;
          cleanup_regions(local_b0,local_b8);
          iVar10 = *piVar8;
          if (0 < iVar10) {
            iVar19 = 0;
            do {
              analyze_region(stats_start,iVar19,local_b0);
              iVar19 = iVar19 + 1;
            } while (iVar10 != iVar19);
            if (0 < *local_b8) {
              lVar33 = 0;
              pRVar17 = local_b0;
              do {
                uVar2 = pRVar17->start;
                uVar3 = pRVar17->last;
                pRVar17->start = uVar2 + local_64;
                pRVar17->last = uVar3 + local_64;
                lVar33 = lVar33 + 1;
                pRVar17 = pRVar17 + 1;
              } while (lVar33 < *local_b8);
            }
          }
          free_firstpass_stats_buffers(regions_00,filt_intra_err,local_78,local_88);
          return 0;
        }
        local_b0[iVar19].type = SCENECUT_REGION;
        local_b0[iVar19].start = iVar10;
        local_b0[iVar19].last = iVar10;
        local_90 = iVar19 + 1;
        uVar13 = iVar10 + 1;
      } while( true );
    }
    free_firstpass_stats_buffers(regions_00,filt_intra_err,pdVar12,local_88);
    iVar10 = -1;
  }
  return iVar10;
}

Assistant:

static int identify_regions(const FIRSTPASS_STATS *const stats_start,
                            int total_frames, int offset, REGIONS *regions,
                            int *total_regions) {
  int k;
  if (total_frames <= 1) return 0;

  // store the initial decisions
  REGIONS *temp_regions =
      (REGIONS *)aom_malloc(total_frames * sizeof(temp_regions[0]));
  // buffers for filtered stats
  double *filt_intra_err =
      (double *)aom_calloc(total_frames, sizeof(*filt_intra_err));
  double *filt_coded_err =
      (double *)aom_calloc(total_frames, sizeof(*filt_coded_err));
  double *grad_coded = (double *)aom_calloc(total_frames, sizeof(*grad_coded));
  if (!(temp_regions && filt_intra_err && filt_coded_err && grad_coded)) {
    free_firstpass_stats_buffers(temp_regions, filt_intra_err, filt_coded_err,
                                 grad_coded);
    return -1;
  }
  av1_zero_array(temp_regions, total_frames);

  int cur_region = 0, this_start = 0, this_last;

  int next_scenecut = -1;
  do {
    // first get the obvious scenecuts
    next_scenecut =
        find_next_scenecut(stats_start, this_start, total_frames - 1);
    this_last = (next_scenecut >= 0) ? (next_scenecut - 1) : total_frames - 1;

    // low-pass filter the needed stats
    smooth_filter_stats(stats_start, this_start, this_last, filt_intra_err,
                        filt_coded_err);
    get_gradient(filt_coded_err, this_start, this_last, grad_coded);

    // find tentative stable regions and unstable regions
    int num_regions = find_stable_regions(stats_start, grad_coded, this_start,
                                          this_last, temp_regions);

    adjust_unstable_region_bounds(stats_start, temp_regions, &num_regions);

    get_region_stats(stats_start, temp_regions, num_regions);

    // Try to identify blending regions in the unstable regions
    find_blending_regions(stats_start, temp_regions, &num_regions);
    cleanup_blendings(temp_regions, &num_regions);

    // The flash points should all be considered high variance points
    k = 0;
    while (k < num_regions) {
      if (temp_regions[k].type != STABLE_REGION) {
        k++;
        continue;
      }
      int start = temp_regions[k].start;
      int last = temp_regions[k].last;
      for (int i = start; i <= last; i++) {
        if (stats_start[i].is_flash) {
          insert_region(i, i, HIGH_VAR_REGION, temp_regions, &num_regions, &k);
        }
      }
      k++;
    }
    cleanup_regions(temp_regions, &num_regions);

    // copy the regions in the scenecut group
    for (k = 0; k < num_regions; k++) {
      if (temp_regions[k].last < temp_regions[k].start &&
          k == num_regions - 1) {
        num_regions--;
        break;
      }
      regions[k + cur_region] = temp_regions[k];
    }
    cur_region += num_regions;

    // add the scenecut region
    if (next_scenecut > -1) {
      // add the scenecut region, and find the next scenecut
      regions[cur_region].type = SCENECUT_REGION;
      regions[cur_region].start = next_scenecut;
      regions[cur_region].last = next_scenecut;
      cur_region++;
      this_start = next_scenecut + 1;
    }
  } while (next_scenecut >= 0);

  *total_regions = cur_region;
  get_region_stats(stats_start, regions, *total_regions);

  for (k = 0; k < *total_regions; k++) {
    // If scenecuts are very minor, mark them as high variance.
    if (regions[k].type != SCENECUT_REGION ||
        regions[k].avg_cor_coeff *
                (1 - stats_start[regions[k].start].noise_var /
                         regions[k].avg_intra_err) <
            0.8) {
      continue;
    }
    regions[k].type = HIGH_VAR_REGION;
  }
  cleanup_regions(regions, total_regions);
  get_region_stats(stats_start, regions, *total_regions);

  for (k = 0; k < *total_regions; k++) {
    regions[k].start += offset;
    regions[k].last += offset;
  }

  free_firstpass_stats_buffers(temp_regions, filt_intra_err, filt_coded_err,
                               grad_coded);
  return 0;
}